

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::StreamingReporterBase::testRunStarting(StreamingReporterBase *this,TestRunInfo *_testRunInfo)

{
  pointer pcVar1;
  undefined1 local_40 [24];
  undefined1 local_28 [16];
  
  local_40._8_8_ = local_28;
  pcVar1 = (_testRunInfo->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_40 + 8),pcVar1,pcVar1 + (_testRunInfo->name)._M_string_length);
  local_40._0_8_ = (string *)(local_40 + 8);
  Option<Catch::TestRunInfo>::operator=(&this->testRunInfo,(Option<Catch::TestRunInfo> *)local_40);
  if (((string *)local_40._0_8_ != (string *)0x0) &&
     (*(string **)local_40._0_8_ != (string *)(local_40._0_8_ + 0x10))) {
    operator_delete(*(string **)local_40._0_8_);
  }
  return;
}

Assistant:

virtual void testRunStarting( TestRunInfo const& _testRunInfo ) {
            testRunInfo = _testRunInfo;
        }